

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::SectionStats::~SectionStats(SectionStats *this)

{
  SectionStats *this_local;
  
  this->_vptr_SectionStats = (_func_int **)&PTR__SectionStats_0025bce0;
  SectionInfo::~SectionInfo(&this->sectionInfo);
  return;
}

Assistant:

SectionStats::~SectionStats() = default;